

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

void * ffi_checkptr(lua_State *L,int narg,CTypeID id)

{
  CTState *cts;
  void *p;
  void *local_10;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  if (L->base + ((ulong)(uint)narg - 1) < L->top) {
    lj_cconv_ct_tv(cts,cts->tab + id,(uint8_t *)&local_10,L->base + ((ulong)(uint)narg - 1),
                   narg << 8);
    return local_10;
  }
  lj_err_arg(L,narg,LJ_ERR_NOVAL);
}

Assistant:

static void *ffi_checkptr(lua_State *L, int narg, CTypeID id)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  void *p;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, id), (uint8_t *)&p, o, CCF_ARG(narg));
  return p;
}